

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O2

Cut_Cut_t * Cut_CutMergeTwo2(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Cut_Cut_t *pCVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  char *__assertion;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int (*paiVar17) [3];
  uint uVar18;
  
  uVar18 = *(uint *)pCut0;
  uVar5 = uVar18 >> 0x1c;
  uVar9 = (ulong)uVar5;
  uVar6 = *(uint *)pCut1 >> 0x1c;
  if (uVar5 < uVar6) {
    __assertion = "pCut0->nLeaves >= pCut1->nLeaves";
    uVar18 = 0x35;
LAB_0070e421:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                  ,uVar18,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar2 = p->pParams->nVarsMax;
  if (uVar6 == uVar2 && uVar5 == uVar2) {
    pCVar7 = (Cut_Cut_t *)0x0;
    uVar8 = 0;
    do {
      if (uVar9 == uVar8) {
        pCVar7 = Cut_CutAlloc(p);
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          *(undefined4 *)(&pCVar7[1].field_0x0 + uVar8 * 4) =
               *(undefined4 *)(&pCut0[1].field_0x0 + uVar8 * 4);
        }
        goto LAB_0070e3b6;
      }
      lVar10 = uVar8 * 4;
      lVar1 = uVar8 * 4;
      uVar8 = uVar8 + 1;
    } while (*(int *)(&pCut0[1].field_0x0 + lVar10) == *(int *)(&pCut1[1].field_0x0 + lVar1));
  }
  else {
    if (uVar5 == uVar2) {
      for (uVar8 = 0; uVar15 = (ulong)(uVar18 >> 0x1c), uVar8 != uVar6; uVar8 = uVar8 + 1) {
        do {
          if ((long)uVar15 < 1) {
            return (Cut_Cut_t *)0x0;
          }
          lVar10 = uVar15 * 4;
          uVar15 = uVar15 - 1;
        } while (*(int *)((long)&pCut0->pNext + lVar10 + 4) !=
                 *(int *)(&pCut1[1].field_0x0 + uVar8 * 4));
      }
      pCVar7 = Cut_CutAlloc(p);
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)(&pCVar7[1].field_0x0 + uVar8 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + uVar8 * 4);
      }
LAB_0070e3b6:
      uVar18 = uVar18 & 0xf0000000;
    }
    else {
      paiVar17 = Cut_CutMergeTwo2::M;
      iVar12 = Cut_CutMergeTwo2::M[0][0];
      iVar16 = Cut_CutMergeTwo2::M[0][1];
      iVar13 = Cut_CutMergeTwo2::M[0][2];
      for (uVar8 = 0; iVar11 = (int)uVar9, uVar15 = (ulong)(uVar18 >> 0x1c), uVar8 != uVar6;
          uVar8 = uVar8 + 1) {
        do {
          if ((long)uVar15 < 1) {
            if (iVar12 == 0) {
              iVar12 = *(int *)(&pCut1[1].field_0x0 + uVar8 * 4);
              Cut_CutMergeTwo2::M[0][1] = 0;
              iVar16 = 0;
              Cut_CutMergeTwo2::M[0][0] = iVar12;
            }
            else if (iVar16 == 0) {
              iVar16 = *(int *)(&pCut1[1].field_0x0 + uVar8 * 4);
              Cut_CutMergeTwo2::M[0][2] = 0;
              iVar13 = 0;
              Cut_CutMergeTwo2::M[0][1] = iVar16;
            }
            else {
              if (iVar13 != 0) {
                __assertion = "0";
                uVar18 = 0x7d;
                goto LAB_0070e421;
              }
              iVar13 = *(int *)(&pCut1[1].field_0x0 + uVar8 * 4);
              Cut_CutMergeTwo2::M[0][2] = iVar13;
            }
            if ((int)uVar2 <= iVar11) {
              for (lVar10 = 0; (ulong)(uVar18 >> 0x1c) * 0xc + 0xc != lVar10; lVar10 = lVar10 + 0xc)
              {
                *(undefined4 *)((long)Cut_CutMergeTwo2::M[0] + lVar10) = 0;
              }
              return (Cut_Cut_t *)0x0;
            }
            goto LAB_0070e2bf;
          }
          iVar3 = *(int *)((long)&pCut0->pNext + uVar15 * 4 + 4);
          uVar15 = uVar15 - 1;
          iVar4 = *(int *)(&pCut1[1].field_0x0 + uVar8 * 4);
        } while (iVar4 < iVar3);
        if (iVar3 < iVar4) {
          uVar14 = (int)uVar15 + 1;
          if (Cut_CutMergeTwo2::M[uVar14][0] == 0) {
            Cut_CutMergeTwo2::M[uVar14][0] = iVar4;
            Cut_CutMergeTwo2::M[uVar14][1] = 0;
          }
          else if (Cut_CutMergeTwo2::M[uVar14][1] == 0) {
            Cut_CutMergeTwo2::M[uVar14][1] = iVar4;
            Cut_CutMergeTwo2::M[uVar14][2] = 0;
          }
          else {
            if (Cut_CutMergeTwo2::M[uVar14][2] != 0) {
              __assertion = "0";
              uVar18 = 0x69;
              goto LAB_0070e421;
            }
            Cut_CutMergeTwo2::M[uVar14][2] = iVar4;
          }
          if ((int)uVar2 <= iVar11) {
            for (lVar10 = 0; (ulong)(uVar18 >> 0x1c) * 0xc + 0xc != lVar10; lVar10 = lVar10 + 0xc) {
              *(undefined4 *)((long)Cut_CutMergeTwo2::M[0] + lVar10) = 0;
            }
            return (Cut_Cut_t *)0x0;
          }
LAB_0070e2bf:
          uVar9 = (ulong)(iVar11 + 1);
        }
      }
      pCVar7 = Cut_CutAlloc(p);
      iVar13 = 0;
      for (uVar9 = 0; uVar5 + 1 != uVar9; uVar9 = uVar9 + 1) {
        if (uVar9 != 0) {
          lVar10 = (long)iVar13;
          iVar13 = iVar13 + 1;
          *(undefined4 *)(&pCVar7[1].field_0x0 + lVar10 * 4) =
               *(undefined4 *)((long)&pCut0->pNext + uVar9 * 4 + 4);
        }
        if ((*paiVar17)[0] != 0) {
          *(int *)(&pCVar7[1].field_0x0 + (long)iVar13 * 4) = (*paiVar17)[0];
          iVar12 = iVar13 + 1;
          if ((*paiVar17)[1] != 0) {
            *(int *)(&pCVar7[1].field_0x0 + (long)(iVar13 + 1) * 4) = (*paiVar17)[1];
            iVar12 = iVar13 + 2;
            if ((*paiVar17)[2] != 0) {
              *(int *)(&pCVar7[1].field_0x0 + (long)(iVar13 + 2) * 4) = (*paiVar17)[2];
              iVar12 = iVar13 + 3;
            }
          }
          iVar13 = iVar12;
          (*paiVar17)[0] = 0;
        }
        paiVar17 = paiVar17 + 1;
      }
      if (iVar13 != iVar11) {
        __assert_fail("Count == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                      ,0x9a,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
      }
      uVar18 = iVar11 << 0x1c;
    }
    *(uint *)pCVar7 = *(uint *)pCVar7 & 0xfffffff | uVar18;
  }
  return pCVar7;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Merges two cuts.]

  Description [This procedure works.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cut_Cut_t * Cut_CutMergeTwo2( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    static int M[7][3] = {{0},{0},{0},{0},{0},{0},{0}};
    Cut_Cut_t * pRes;
    int * pRow;
    int nLeaves0, nLeaves1, Limit;
    int i, k, Count, nNodes;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // other cases
    nNodes = nLeaves0;
    for ( i = 0; i < nLeaves1; i++ )
    {
        for ( k = nLeaves0 - 1; k >= 0; k-- )
        {
            if ( pCut0->pLeaves[k] > pCut1->pLeaves[i] )
                continue;
            if ( pCut0->pLeaves[k] < pCut1->pLeaves[i] )
            {
                pRow = M[k+1];
                if ( pRow[0] == 0 )
                    pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
                else if ( pRow[1] == 0 )
                    pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
                else if ( pRow[2] == 0 )
                    pRow[2] = pCut1->pLeaves[i];
                else 
                    assert( 0 );
                if ( ++nNodes > Limit )
                {
                    for ( i = 0; i <= nLeaves0; i++ )
                        M[i][0] = 0;
                    return NULL;
                }
            }
            break;
        }
        if ( k == -1 )
        {
            pRow = M[0];
            if ( pRow[0] == 0 )
                pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
            else if ( pRow[1] == 0 )
                pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
            else if ( pRow[2] == 0 )
                pRow[2] = pCut1->pLeaves[i];
            else 
                assert( 0 );
            if ( ++nNodes > Limit )
            {
                for ( i = 0; i <= nLeaves0; i++ )
                    M[i][0] = 0;
                return NULL;
            }
            continue;
        }
    }

    pRes = Cut_CutAlloc( p );
    for ( Count = 0, i = 0; i <= nLeaves0; i++ )
    {
        if ( i > 0 )
            pRes->pLeaves[Count++] = pCut0->pLeaves[i-1];
        pRow = M[i];
        if ( pRow[0] )
        {
            pRes->pLeaves[Count++] = pRow[0];
            if ( pRow[1] )
            {
                pRes->pLeaves[Count++] = pRow[1];
                if ( pRow[2] )
                    pRes->pLeaves[Count++] = pRow[2];
            }
            pRow[0] = 0;
        }
    }
    assert( Count == nNodes );
    pRes->nLeaves = nNodes;
    return pRes;
}